

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void capnp::compiler::findImports
               (Reader exp,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  Reader exp_00;
  Reader exp_01;
  Reader exp_02;
  Reader exp_03;
  Reader exp_04;
  ListElementCount LVar1;
  undefined2 uVar2;
  ElementCount EVar3;
  Reader element;
  StructReader local_180;
  PointerReader local_150;
  ListReader local_130;
  CapTableReader *local_100;
  SegmentReader *local_f8;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (exp._reader.dataSize < 0x10) {
    uVar2 = 0;
  }
  else {
    uVar2 = *exp._reader.data;
  }
  switch(uVar2) {
  case 6:
    if (exp._reader.pointerCount == 0) {
      exp._reader.nestingLimit = 0x7fffffff;
      exp._reader.capTable = (CapTableReader *)0x0;
      exp._reader.pointers = (WirePointer *)0x0;
      exp._reader.segment = (SegmentReader *)0x0;
    }
    local_180.capTable = exp._reader.capTable;
    local_180.segment = exp._reader.segment;
    EVar3 = 0;
    local_180.data = exp._reader.pointers;
    local_180.pointers._0_4_ = exp._reader.nestingLimit;
    capnp::_::PointerReader::getList
              (&local_130,(PointerReader *)&local_180,INLINE_COMPOSITE,(word *)0x0);
    if (local_130.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_180,&local_130,EVar3);
        exp_02._reader.pointers._4_4_ = local_180.pointers._4_4_;
        exp_02._reader.pointers._0_4_ = (int)local_180.pointers;
        exp_02._reader.pointerCount = local_180.pointerCount;
        exp_02._reader.dataSize = local_180.dataSize;
        exp_02._reader._38_2_ = local_180._38_2_;
        exp_02._reader._44_4_ = local_180._44_4_;
        exp_02._reader.nestingLimit = local_180.nestingLimit;
        exp_02._reader.data = local_180.data;
        exp_02._reader.segment = local_180.segment;
        exp_02._reader.capTable = local_180.capTable;
        findImports(exp_02,output);
        EVar3 = EVar3 + 1;
      } while (local_130.elementCount != EVar3);
    }
    break;
  case 7:
    if (exp._reader.pointerCount == 0) {
      exp._reader.nestingLimit = 0x7fffffff;
      exp._reader.capTable = (CapTableReader *)0x0;
      exp._reader.pointers = (WirePointer *)0x0;
      exp._reader.segment = (SegmentReader *)0x0;
    }
    local_180.capTable = exp._reader.capTable;
    local_180.segment = exp._reader.segment;
    EVar3 = 0;
    local_180.data = exp._reader.pointers;
    local_180.pointers._0_4_ = exp._reader.nestingLimit;
    capnp::_::PointerReader::getList
              (&local_130,(PointerReader *)&local_180,INLINE_COMPOSITE,(word *)0x0);
    if (local_130.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_180,&local_130,EVar3);
        if (local_180.pointerCount < 2) {
          local_150.nestingLimit = 0x7fffffff;
          local_150.capTable = (CapTableReader *)0x0;
          local_150.pointer = (WirePointer *)0x0;
          local_150.segment = (SegmentReader *)0x0;
        }
        else {
          local_150.pointer =
               (WirePointer *)(CONCAT44(local_180.pointers._4_4_,(int)local_180.pointers) + 8);
          local_150.capTable = local_180.capTable;
          local_150.segment = local_180.segment;
          local_150.nestingLimit = local_180.nestingLimit;
        }
        capnp::_::PointerReader::getStruct(&local_c0,&local_150,(word *)0x0);
        exp_03._reader.capTable = local_c0.capTable;
        exp_03._reader.segment = local_c0.segment;
        exp_03._reader.data = local_c0.data;
        exp_03._reader.pointers = local_c0.pointers;
        exp_03._reader.dataSize = local_c0.dataSize;
        exp_03._reader.pointerCount = local_c0.pointerCount;
        exp_03._reader._38_2_ = local_c0._38_2_;
        exp_03._reader.nestingLimit = local_c0.nestingLimit;
        exp_03._reader._44_4_ = local_c0._44_4_;
        findImports(exp_03,output);
        EVar3 = EVar3 + 1;
      } while (local_130.elementCount != EVar3);
    }
    break;
  case 9:
    local_f8 = exp._reader.segment;
    local_100 = exp._reader.capTable;
    local_130.ptr = (byte *)exp._reader.pointers;
    local_130.elementCount = exp._reader.nestingLimit;
    if (exp._reader.pointerCount == 0) {
      exp._reader.capTable = (CapTableReader *)0x0;
      exp._reader.segment = (SegmentReader *)0x0;
      local_130.ptr = (byte *)(WirePointer *)0x0;
      local_130.elementCount = 0x7fffffff;
    }
    local_130.segment = exp._reader.segment;
    local_130.capTable = exp._reader.capTable;
    capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_130,(word *)0x0);
    exp_00._reader.capTable = local_60.capTable;
    exp_00._reader.segment = local_60.segment;
    exp_00._reader.data = local_60.data;
    exp_00._reader.pointers = local_60.pointers;
    exp_00._reader.dataSize = local_60.dataSize;
    exp_00._reader.pointerCount = local_60.pointerCount;
    exp_00._reader._38_2_ = local_60._38_2_;
    exp_00._reader.nestingLimit = local_60.nestingLimit;
    exp_00._reader._44_4_ = local_60._44_4_;
    findImports(exp_00,output);
    local_180.data = (WirePointer *)0x0;
    local_180.segment = (SegmentReader *)0x0;
    local_180.capTable = (CapTableReader *)0x0;
    local_180.pointers._0_4_ = 0x7fffffff;
    if (1 < exp._reader.pointerCount) {
      local_180.data = exp._reader.pointers + 1;
      local_180.segment = local_f8;
      local_180.capTable = local_100;
      local_180.pointers._0_4_ = exp._reader.nestingLimit;
    }
    EVar3 = 0;
    capnp::_::PointerReader::getList
              (&local_130,(PointerReader *)&local_180,INLINE_COMPOSITE,(word *)0x0);
    LVar1 = local_130.elementCount;
    if (local_130.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_180,&local_130,EVar3);
        if (local_180.pointerCount < 2) {
          local_150.nestingLimit = 0x7fffffff;
          local_150.capTable = (CapTableReader *)0x0;
          local_150.pointer = (WirePointer *)0x0;
          local_150.segment = (SegmentReader *)0x0;
        }
        else {
          local_150.pointer =
               (WirePointer *)(CONCAT44(local_180.pointers._4_4_,(int)local_180.pointers) + 8);
          local_150.capTable = local_180.capTable;
          local_150.segment = local_180.segment;
          local_150.nestingLimit = local_180.nestingLimit;
        }
        capnp::_::PointerReader::getStruct(&local_f0,&local_150,(word *)0x0);
        exp_01._reader.capTable = local_f0.capTable;
        exp_01._reader.segment = local_f0.segment;
        exp_01._reader.data = local_f0.data;
        exp_01._reader.pointers = local_f0.pointers;
        exp_01._reader.dataSize = local_f0.dataSize;
        exp_01._reader.pointerCount = local_f0.pointerCount;
        exp_01._reader._38_2_ = local_f0._38_2_;
        exp_01._reader.nestingLimit = local_f0.nestingLimit;
        exp_01._reader._44_4_ = local_f0._44_4_;
        findImports(exp_01,output);
        EVar3 = EVar3 + 1;
      } while (LVar1 != EVar3);
    }
    break;
  case 10:
    if (exp._reader.pointerCount == 0) {
      exp._reader.nestingLimit = 0x7fffffff;
      exp._reader.capTable = (CapTableReader *)0x0;
      exp._reader.pointers = (WirePointer *)0x0;
      exp._reader.segment = (SegmentReader *)0x0;
    }
    local_130.segment = exp._reader.segment;
    local_130.capTable = exp._reader.capTable;
    local_130.ptr = (byte *)exp._reader.pointers;
    local_130.elementCount = exp._reader.nestingLimit;
    capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_130,(word *)0x0);
    exp_04._reader.capTable = local_90.capTable;
    exp_04._reader.segment = local_90.segment;
    exp_04._reader.data = local_90.data;
    exp_04._reader.pointers = local_90.pointers;
    exp_04._reader.dataSize = local_90.dataSize;
    exp_04._reader.pointerCount = local_90.pointerCount;
    exp_04._reader._38_2_ = local_90._38_2_;
    exp_04._reader.nestingLimit = local_90.nestingLimit;
    exp_04._reader._44_4_ = local_90._44_4_;
    findImports(exp_04,output);
    break;
  case 0xc:
    if (exp._reader.pointerCount == 0) {
      exp._reader.capTable = (CapTableReader *)0x0;
      exp._reader.pointers = (WirePointer *)0x0;
      exp._reader.segment = (SegmentReader *)0x0;
      exp._reader.nestingLimit = 0x7fffffff;
    }
    local_180.data = exp._reader.pointers;
    local_180.pointers._0_4_ = exp._reader.nestingLimit;
    local_180.segment = exp._reader.segment;
    local_180.capTable = exp._reader.capTable;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_130,(PointerReader *)&local_180,(word *)0x0);
    local_180.data = (void *)0x0;
    local_180.segment = (SegmentReader *)0x0;
    local_180.capTable = (CapTableReader *)0x0;
    local_180.pointers._0_4_ = 0x7fffffff;
    if (local_130.structPointerCount != 0) {
      local_180.data = (void *)CONCAT44(local_130.step,local_130.elementCount);
      local_180.segment = local_130.segment;
      local_180.capTable = local_130.capTable;
      local_180.pointers._0_4_ = local_130.nestingLimit;
    }
    local_180._0_16_ =
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_180,(void *)0x0,0);
    std::
    _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
    ::_M_insert_unique<kj::StringPtr>(&output->_M_t,(StringPtr *)&local_180);
  }
  return;
}

Assistant:

static void findImports(Expression::Reader exp, std::set<kj::StringPtr>& output) {
  switch (exp.which()) {
    case Expression::UNKNOWN:
    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::RELATIVE_NAME:
    case Expression::ABSOLUTE_NAME:
    case Expression::EMBED:
      break;

    case Expression::IMPORT:
      output.insert(exp.getImport().getValue());
      break;

    case Expression::LIST:
      for (auto element: exp.getList()) {
        findImports(element, output);
      }
      break;

    case Expression::TUPLE:
      for (auto element: exp.getTuple()) {
        findImports(element.getValue(), output);
      }
      break;

    case Expression::APPLICATION: {
      auto app = exp.getApplication();
      findImports(app.getFunction(), output);
      for (auto param: app.getParams()) {
        findImports(param.getValue(), output);
      }
      break;
    }

    case Expression::MEMBER: {
      findImports(exp.getMember().getParent(), output);
      break;
    }
  }
}